

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLsSetup(ARKodeMem ark_mem,int convfail,sunrealtype tpred,N_Vector ypred,N_Vector fpred,
              int *jcurPtr,N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  int line;
  undefined8 uVar5;
  char *msgfmt;
  int dgamma_fail;
  N_Vector local_50;
  sunrealtype gamma;
  int *jcur;
  sunrealtype gamrat;
  
  local_50 = vtemp1;
  pvVar3 = (*ark_mem->step_getlinmem)(ark_mem);
  if (pvVar3 == (void *)0x0) {
    arkProcessError(ark_mem,-2,0xff8,"arkLsSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"Linear solver memory is NULL.");
    return -2;
  }
  iVar1 = SUNLinSolGetType(*(undefined8 *)((long)pvVar3 + 0x38));
  if (iVar1 == 3) {
    *(undefined4 *)((long)pvVar3 + 0x130) = 0;
    return 0;
  }
  *(sunrealtype *)((long)pvVar3 + 0x78) = tpred;
  *(N_Vector *)((long)pvVar3 + 0x60) = ypred;
  *(N_Vector *)((long)pvVar3 + 0x68) = fpred;
  iVar1 = (*ark_mem->step_getgammas)(ark_mem,&gamma,&gamrat,&jcur,&dgamma_fail);
  *(int *)((long)pvVar3 + 0x130) = iVar1;
  if (iVar1 == 0) {
    uVar2 = 1;
    if (((ark_mem->initsetup == 0) &&
        (ark_mem->nst < *(long *)((long)pvVar3 + 0x70) + *(long *)((long)pvVar3 + 0x90))) &&
       ((convfail != 1 || (dgamma_fail != 0)))) {
      uVar2 = (uint)(convfail == 2);
    }
    *(uint *)((long)pvVar3 + 0x20) = uVar2;
    if ((ark_mem->step_getmassmem == (ARKTimestepGetMassMemFn)0x0) ||
       (pvVar4 = (*ark_mem->step_getmassmem)(ark_mem), pvVar4 == (void *)0x0)) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(undefined8 *)((long)pvVar4 + 0x10);
      iVar1 = arkLsMassSetup(ark_mem,tpred,local_50,vtemp2,vtemp3);
      *(int *)((long)pvVar3 + 0x130) = iVar1;
      if (iVar1 != 0) {
        msgfmt = "Error setting up mass-matrix linear solver";
        iVar1 = -0xb;
        line = 0xc9a;
        goto LAB_00142dfb;
      }
    }
    if (*(long *)((long)pvVar3 + 0x40) == 0) {
      *jcurPtr = *(int *)((long)pvVar3 + 0x20);
      uVar5 = 0;
    }
    else {
      iVar1 = (**(code **)((long)pvVar3 + 0x120))
                        (tpred,gamma,ypred,fpred,*(long *)((long)pvVar3 + 0x40),uVar5,
                         *(int *)((long)pvVar3 + 0x20) == 0,jcurPtr,
                         *(undefined8 *)((long)pvVar3 + 0x128),local_50,vtemp2,vtemp3);
      if (*jcurPtr != 0) {
        *(long *)((long)pvVar3 + 0x80) = *(long *)((long)pvVar3 + 0x80) + 1;
        *(long *)((long)pvVar3 + 0x90) = ark_mem->nst;
        *(sunrealtype *)((long)pvVar3 + 200) = tpred;
      }
      if (iVar1 != 0) {
        if (*(int *)((long)pvVar3 + 0x118) == 0) {
          return iVar1;
        }
        if (-1 < iVar1) {
          *(undefined4 *)((long)pvVar3 + 0x130) = 0xfffffff8;
          return 1;
        }
        arkProcessError(ark_mem,-7,0xcb7,"arkLsSetup",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"The Jacobian routine failed in an unrecoverable manner.");
        *(undefined4 *)((long)pvVar3 + 0x130) = 0xfffffff9;
        return -1;
      }
      uVar5 = *(undefined8 *)((long)pvVar3 + 0x40);
    }
    iVar1 = SUNLinSolSetup(*(undefined8 *)((long)pvVar3 + 0x38),uVar5);
    *(int *)((long)pvVar3 + 0x130) = iVar1;
    if (*(long *)((long)pvVar3 + 0x40) != 0) {
      return iVar1;
    }
    if (*jcurPtr != 0) {
      *(long *)((long)pvVar3 + 0x98) = *(long *)((long)pvVar3 + 0x98) + 1;
      *(long *)((long)pvVar3 + 0x90) = ark_mem->nst;
      *(sunrealtype *)((long)pvVar3 + 200) = tpred;
    }
    if (*(int *)((long)pvVar3 + 0x20) == 0) {
      return iVar1;
    }
    *jcurPtr = 1;
  }
  else {
    msgfmt = "An error occurred in ark_step_getgammas";
    line = 0xc7d;
LAB_00142dfb:
    arkProcessError(ark_mem,iVar1,line,"arkLsSetup",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,msgfmt);
  }
  return *(int *)((long)pvVar3 + 0x130);
}

Assistant:

int arkLsSetup(ARKodeMem ark_mem, int convfail, sunrealtype tpred,
               N_Vector ypred, N_Vector fpred, sunbooleantype* jcurPtr,
               N_Vector vtemp1, N_Vector vtemp2, N_Vector vtemp3)
{
  ARKLsMem arkls_mem     = NULL;
  void* ark_step_massmem = NULL;
  SUNMatrix M            = NULL;
  sunrealtype gamma, gamrat;
  sunbooleantype dgamma_fail, *jcur;
  int retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Immediately return when using matrix-embedded linear solver */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    arkls_mem->last_flag = ARKLS_SUCCESS;
    return (arkls_mem->last_flag);
  }

  /* Set ARKLs time and N_Vector pointers to current time,
     solution and rhs */
  arkls_mem->tcur = tpred;
  arkls_mem->ycur = ypred;
  arkls_mem->fcur = fpred;

  /* get gamma values from time step module */
  arkls_mem->last_flag = ark_mem->step_getgammas(ark_mem, &gamma, &gamrat,
                                                 &jcur, &dgamma_fail);
  if (arkls_mem->last_flag)
  {
    arkProcessError(ark_mem, arkls_mem->last_flag, __LINE__, __func__, __FILE__,
                    "An error occurred in ark_step_getgammas");
    return (arkls_mem->last_flag);
  }

  /* Use initsetup, gamma/gammap, and convfail to set J/P eval. flag jok;
     Note: the "ARK_FAIL_BAD_J" test is asking whether the nonlinear
     solver converged due to a bad system Jacobian AND our gamma was
     fine, indicating that the J and/or P were invalid */
  arkls_mem->jbad = (ark_mem->initsetup) ||
                    (ark_mem->nst >= arkls_mem->nstlj + arkls_mem->msbj) ||
                    ((convfail == ARK_FAIL_BAD_J) && (!dgamma_fail)) ||
                    (convfail == ARK_FAIL_OTHER);

  /* Check for mass matrix module and setup mass matrix */
  if (ark_mem->step_getmassmem)
  {
    ark_step_massmem = ark_mem->step_getmassmem(ark_mem);
  }

  if (ark_step_massmem)
  {
    /* Set shortcut to the mass matrix (NULL if matrix-free) */
    M = ((ARKLsMassMem)ark_step_massmem)->M;

    /* Setup mass matrix linear solver (including recomputation of mass matrix) */
    arkls_mem->last_flag = arkLsMassSetup(ark_mem, tpred, vtemp1, vtemp2, vtemp3);
    if (arkls_mem->last_flag)
    {
      arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                      "Error setting up mass-matrix linear solver");
      return (arkls_mem->last_flag);
    }
  }

  /* Setup the linear system if necessary */
  if (arkls_mem->A != NULL)
  {
    /* Update J if appropriate and evaluate A = I-gamma*J or A = M-gamma*J */
    retval = arkls_mem->linsys(tpred, ypred, fpred, arkls_mem->A, M,
                               !(arkls_mem->jbad), jcurPtr, gamma,
                               arkls_mem->A_data, vtemp1, vtemp2, vtemp3);

    /* Update J eval count and step when J was last updated */
    if (*jcurPtr)
    {
      arkls_mem->nje++;
      arkls_mem->nstlj = ark_mem->nst;
      arkls_mem->tnlj  = tpred;
    }

    /* Check linsys() return value and return if necessary */
    if (retval != ARKLS_SUCCESS)
    {
      if (arkls_mem->user_linsys)
      {
        if (retval < 0)
        {
          arkProcessError(ark_mem, ARKLS_JACFUNC_UNRECVR, __LINE__, __func__,
                          __FILE__, MSG_LS_JACFUNC_FAILED);
          arkls_mem->last_flag = ARKLS_JACFUNC_UNRECVR;
          return (-1);
        }
        else
        {
          arkls_mem->last_flag = ARKLS_JACFUNC_RECVR;
          return (1);
        }
      }
      else { return (retval); }
    }
  }
  else
  {
    /* Matrix-free case, set jcur to jbad */
    *jcurPtr = arkls_mem->jbad;
  }

  /* Call LS setup routine -- the LS may call arkLsPSetup, who will
     pass the heuristic suggestions above to the user code(s) */
  arkls_mem->last_flag = SUNLinSolSetup(arkls_mem->LS, arkls_mem->A);

  /* If the SUNMatrix was NULL, update heuristics flags */
  if (arkls_mem->A == NULL)
  {
    /* If user set jcur to SUNTRUE, increment npe and save nst value */
    if (*jcurPtr)
    {
      arkls_mem->npe++;
      arkls_mem->nstlj = ark_mem->nst;
      arkls_mem->tnlj  = tpred;
    }

    /* Update jcurPtr flag if we suggested an update */
    if (arkls_mem->jbad) { *jcurPtr = SUNTRUE; }
  }

  return (arkls_mem->last_flag);
}